

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_close(fdb_file_handle *fhandle)

{
  wal_dirty_t wVar1;
  fdb_status fVar2;
  size_t sVar3;
  
  if (fhandle == (fdb_file_handle *)0x0) {
    fVar2 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    if (((((fhandle->root->config).auto_commit == true) &&
         (sVar3 = filemgr_get_ref_count(fhandle->root->file), sVar3 == 1)) &&
        (wVar1 = wal_get_dirty_status(fhandle->root->file), wVar1 == '\x01')) &&
       (fVar2 = fdb_commit(fhandle,'\x01'), fVar2 != FDB_RESULT_SUCCESS)) {
      return fVar2;
    }
    filemgr_fhandle_remove(fhandle->root->file,fhandle);
    fVar2 = _fdb_close_root(fhandle->root);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_file_handle_close_all(fhandle);
      fdb_file_handle_free(fhandle);
      fVar2 = FDB_RESULT_SUCCESS;
    }
    else {
      filemgr_fhandle_add(fhandle->root->file,fhandle);
    }
  }
  return fVar2;
}

Assistant:

fdb_status _fdb_close(fdb_kvs_handle *handle)
{
    fdb_status fs;
    if (!(handle->config.flags & FDB_OPEN_FLAG_RDONLY)) {
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // read-only file is not registered in compactor
            compactor_deregister_file(handle->file);
        }
        bgflusher_deregister_file(handle->file);
    }

    btreeblk_end(handle->bhandle);
    btreeblk_free(handle->bhandle);

    if (handle->shandle) { // must close wal_snapshot before file
        wal_snapshot_close(handle->shandle, handle->file);
        filemgr_dirty_update_close_node(handle->file,
            btreeblk_get_dirty_update(handle->bhandle));
        btreeblk_clear_dirty_update(handle->bhandle);
    }

    fs = filemgr_close(handle->file, handle->config.cleanup_cache_onclose,
                                  handle->filename, &handle->log_callback);
    if (fs != FDB_RESULT_SUCCESS) {
        return fs;
    }
    docio_free(handle->dhandle);
    hbtrie_free(handle->trie);
    free(handle->trie);

    if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
        if (handle->kvs) {
            // multi KV instance mode
            hbtrie_free(handle->seqtrie);
            free(handle->seqtrie);
        } else {
            free(handle->seqtree->kv_ops);
            free(handle->seqtree);
        }
    }

    if (handle->staletree) {
        free(handle->staletree->kv_ops);
        free(handle->staletree);
    }

    free(handle->bhandle);
    free(handle->dhandle);
    if (handle->filename) {
        free(handle->filename);
        handle->filename = NULL;
    }

    _destroy_bottom_up_build_entries(handle);

    return fs;
}